

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XMLScanner::scanXMLDecl(XMLScanner *this,DeclTypes type)

{
  XMLBufferMgr *this_00;
  ReaderMgr *this_01;
  short *psVar1;
  XMLCh XVar2;
  uint uVar3;
  XMLSize_t XVar4;
  XMLCh *pXVar5;
  XMLBuffer *toFill;
  XMLReader *pXVar6;
  XMLDocumentHandler *pXVar7;
  DocTypeHandler *pDVar8;
  bool bVar9;
  XMLScanner *pXVar10;
  DeclTypes DVar11;
  bool bVar12;
  bool bVar13;
  XMLCh XVar14;
  int index;
  uint uVar15;
  int iVar16;
  long lVar17;
  byte bVar18;
  XMLCh *pXVar19;
  XMLCh *pXVar20;
  uint uVar21;
  Codes CVar22;
  ulong uVar23;
  bool bVar24;
  bool skippedSomething;
  XMLBufBid bbEncoding;
  XMLBufBid bbVersion;
  XMLBufBid bbStand;
  XMLBufBid bbDummy;
  XMLBufBid bbName;
  XMLBuffer *buffers [4];
  bool local_d9;
  XMLScanner *local_d8;
  DeclTypes local_cc;
  XMLBuffer *local_c8;
  XMLBufferMgr *local_c0;
  uint local_b8 [4];
  ulong local_a8;
  XMLBuffer *local_a0;
  XMLBuffer *local_98;
  XMLBufferMgr *local_90;
  XMLBuffer *local_88;
  XMLBufferMgr *local_80;
  XMLBuffer *local_78;
  XMLBufferMgr *local_70;
  XMLBuffer *local_68;
  XMLBufferMgr *local_60;
  XMLBuffer *local_58 [5];
  
  this_00 = &this->fBufMgr;
  local_98 = XMLBufferMgr::bidOnBuffer(this_00);
  local_90 = this_00;
  local_c8 = XMLBufferMgr::bidOnBuffer(this_00);
  local_c0 = this_00;
  local_88 = XMLBufferMgr::bidOnBuffer(this_00);
  local_80 = this_00;
  local_78 = XMLBufferMgr::bidOnBuffer(this_00);
  local_cc = type;
  local_70 = this_00;
  local_a0 = XMLBufferMgr::bidOnBuffer(this_00);
  local_b8[0] = 0xffffffff;
  local_b8[1] = -1;
  local_b8[2] = -1;
  local_b8[3] = 0xffffffff;
  local_58[0] = local_98;
  local_58[1] = local_c8;
  local_58[2] = local_88;
  local_58[3] = local_78;
  this_01 = &this->fReaderMgr;
  local_a8 = 0;
  local_d8 = this;
  local_68 = local_a0;
  local_60 = this_00;
  do {
    pXVar10 = local_d8;
    ReaderMgr::skipPastSpaces(this_01,&local_d9,true);
    XVar14 = ReaderMgr::peekNextChar(this_01);
    iVar16 = 3;
    if (XVar14 != L'?') {
      if ((int)local_a8 != 0 && local_d9 == false) {
        emitError(pXVar10,ExpectedWhitespace);
      }
      ReaderMgr::getUpToCharOrWS(this_01,local_a0,L'=');
      if (local_a0->fIndex == 0) {
        emitError(pXVar10,ExpectedDeclString);
      }
      XVar4 = local_a0->fIndex;
      pXVar5 = local_a0->fBuffer;
      pXVar5[XVar4] = L'\0';
      pXVar19 = L"version";
      if (pXVar5 == L"version") {
        bVar13 = true;
      }
      else if (pXVar5 == (XMLCh *)0x0) {
LAB_002c8d40:
        bVar13 = *pXVar19 == L'\0';
      }
      else {
        pXVar19 = L"version";
        pXVar20 = pXVar5;
        do {
          XVar14 = *pXVar20;
          if (XVar14 == L'\0') goto LAB_002c8d40;
          pXVar20 = pXVar20 + 1;
          XVar2 = *pXVar19;
          pXVar19 = pXVar19 + 1;
        } while (XVar14 == XVar2);
        bVar13 = false;
      }
      if (bVar13) {
        bVar18 = 0;
        bVar9 = false;
        bVar24 = false;
        uVar23 = 0;
      }
      else {
        pXVar5[XVar4] = L'\0';
        uVar23 = 1;
        bVar9 = true;
        pXVar19 = L"encoding";
        if (pXVar5 == L"encoding") {
LAB_002c8de8:
          bVar18 = 0;
          bVar24 = false;
        }
        else {
          if (pXVar5 == (XMLCh *)0x0) {
LAB_002c8da5:
            if (*pXVar19 == L'\0') goto LAB_002c8de8;
          }
          else {
            pXVar19 = L"encoding";
            pXVar20 = pXVar5;
            do {
              XVar14 = *pXVar20;
              if (XVar14 == L'\0') goto LAB_002c8da5;
              pXVar20 = pXVar20 + 1;
              XVar2 = *pXVar19;
              pXVar19 = pXVar19 + 1;
            } while (XVar14 == XVar2);
          }
          pXVar5[XVar4] = L'\0';
          pXVar19 = L"standalone";
          if (pXVar5 == L"standalone") {
            bVar24 = true;
          }
          else if (pXVar5 == (XMLCh *)0x0) {
LAB_002c8dee:
            bVar24 = *pXVar19 == L'\0';
          }
          else {
            pXVar19 = L"standalone";
            pXVar20 = pXVar5;
            do {
              XVar14 = *pXVar20;
              if (XVar14 == L'\0') goto LAB_002c8dee;
              pXVar20 = pXVar20 + 1;
              XVar2 = *pXVar19;
              pXVar19 = pXVar19 + 1;
            } while (XVar14 == XVar2);
            bVar24 = false;
          }
          bVar18 = bVar24 ^ 1;
          uVar23 = (ulong)bVar24 ^ 3;
          bVar9 = false;
        }
      }
      CVar22 = ExpectedDeclString;
      if ((bVar18 == 0) && (CVar22 = DeclStringRep, local_b8[uVar23] == 0xffffffff)) {
        uVar15 = (int)local_a8 + 1;
        local_a8 = (ulong)uVar15;
        local_b8[uVar23] = uVar15;
      }
      else {
        pXVar5[XVar4] = L'\0';
        emitError(pXVar10,CVar22,pXVar5,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      bVar12 = scanEq(pXVar10,true);
      if (!bVar12) {
        emitError(pXVar10,ExpectedEqSign);
      }
      toFill = local_58[uVar23];
      bVar12 = getQuotedString(pXVar10,toFill);
      if (bVar12) {
        pXVar5 = toFill->fBuffer;
        pXVar5[toFill->fIndex] = L'\0';
        if (bVar13) {
          if (pXVar5 == L"1.1") {
LAB_002c8fc6:
            if (local_cc == Decl_XML) {
              local_d8->fXMLVersion = XMLV1_1;
              (local_d8->fReaderMgr).fXMLVersion = XMLV1_1;
              pXVar6 = (local_d8->fReaderMgr).fCurReader;
              pXVar6->fXMLVersion = XMLV1_1;
              pXVar6->fNEL = true;
              pXVar6->fgCharCharsTable = &XMLChar1_1::fgCharCharsTable1_1;
            }
            else {
              CVar22 = UnsupportedXMLVersion;
              if (local_d8->fXMLVersion != XMLV1_1) goto LAB_002c9055;
            }
          }
          else {
            pXVar19 = L"1.1";
            if (pXVar5 == (XMLCh *)0x0) {
LAB_002c8f83:
              if (*pXVar19 == L'\0') goto LAB_002c8fc6;
            }
            else {
              pXVar19 = L"1.1";
              pXVar20 = pXVar5;
              do {
                XVar14 = *pXVar20;
                if (XVar14 == L'\0') goto LAB_002c8f83;
                pXVar20 = pXVar20 + 1;
                XVar2 = *pXVar19;
                pXVar19 = pXVar19 + 1;
              } while (XVar14 == XVar2);
            }
            if (pXVar5 != L"1.0") {
              pXVar19 = L"1.0";
              if (pXVar5 == (XMLCh *)0x0) {
LAB_002c9020:
                if (*pXVar19 == L'\0') goto joined_r0x002c9075;
              }
              else {
                pXVar19 = L"1.0";
                pXVar20 = pXVar5;
                do {
                  XVar14 = *pXVar20;
                  if (XVar14 == L'\0') goto LAB_002c9020;
                  pXVar20 = pXVar20 + 1;
                  XVar2 = *pXVar19;
                  pXVar19 = pXVar19 + 1;
                } while (XVar14 == XVar2);
              }
              lVar17 = 0;
              do {
                psVar1 = (short *)((long)&XMLUni::fgVersion1 + lVar17);
                lVar17 = lVar17 + 2;
              } while (*psVar1 != 0);
              iVar16 = XMLString::compareNString(pXVar5,L"1.",(lVar17 >> 1) - 1);
              CVar22 = UnsupportedXMLVersion;
              if (iVar16 != 0) goto LAB_002c9055;
            }
joined_r0x002c9075:
            if (local_cc == Decl_XML) {
              iVar16 = 0;
              local_d8->fXMLVersion = XMLV1_0;
              (local_d8->fReaderMgr).fXMLVersion = XMLV1_0;
              pXVar6 = (local_d8->fReaderMgr).fCurReader;
              pXVar6->fXMLVersion = XMLV1_0;
              pXVar6->fNEL = (bool)XMLChar1_0::enableNEL;
              pXVar6->fgCharCharsTable = &XMLChar1_0::fgCharCharsTable1_0;
              goto LAB_002c9113;
            }
          }
LAB_002c9110:
          iVar16 = 0;
        }
        else if (bVar9) {
          bVar13 = XMLString::isValidEncName(pXVar5);
          CVar22 = BadXMLEncoding;
          if (bVar13) goto LAB_002c9110;
LAB_002c9055:
          iVar16 = 0;
          emitError(local_d8,CVar22,pXVar5,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
        else {
          iVar16 = 0;
          if (bVar24 == false) goto LAB_002c9113;
          if (pXVar5 == L"yes") {
LAB_002c916f:
            local_d8->fStandalone = true;
          }
          else {
            pXVar19 = L"yes";
            if (pXVar5 == (XMLCh *)0x0) {
LAB_002c90be:
              if (*pXVar19 == L'\0') goto LAB_002c916f;
            }
            else {
              pXVar19 = L"yes";
              pXVar20 = pXVar5;
              do {
                XVar14 = *pXVar20;
                if (XVar14 == L'\0') goto LAB_002c90be;
                pXVar20 = pXVar20 + 1;
                XVar2 = *pXVar19;
                pXVar19 = pXVar19 + 1;
              } while (XVar14 == XVar2);
            }
            if (pXVar5 == L"no") {
LAB_002c919c:
              local_d8->fStandalone = false;
            }
            else {
              pXVar19 = L"no";
              if (pXVar5 == (XMLCh *)0x0) {
LAB_002c9126:
                if (*pXVar19 == L'\0') goto LAB_002c919c;
              }
              else {
                pXVar19 = L"no";
                pXVar20 = pXVar5;
                do {
                  XVar14 = *pXVar20;
                  if (XVar14 == L'\0') goto LAB_002c9126;
                  pXVar20 = pXVar20 + 1;
                  XVar2 = *pXVar19;
                  pXVar19 = pXVar19 + 1;
                } while (XVar14 == XVar2);
              }
              emitError(local_d8,BadStandalone);
              if (toFill->fIndex == 2) {
                if (((XMLCh)(*pXVar5 | 0x20U) == 0x6e) && ((XMLCh)(pXVar5[1] | 0x20U) == 0x6f))
                goto LAB_002c919c;
              }
              else if ((((toFill->fIndex == 3) && ((XMLCh)(*pXVar5 | 0x20U) == 0x79)) &&
                       ((XMLCh)(pXVar5[1] | 0x20U) == 0x65)) && ((XMLCh)(pXVar5[2] | 0x20U) == 0x73)
                      ) goto LAB_002c916f;
            }
          }
        }
      }
      else {
        emitError(pXVar10,ExpectedQuotedString);
        do {
          XVar14 = ReaderMgr::getNextChar(this_01);
          if (XVar14 == L'\0') break;
        } while (XVar14 != L'>');
        iVar16 = 1;
      }
    }
LAB_002c9113:
    DVar11 = local_cc;
    pXVar10 = local_d8;
  } while (iVar16 == 0);
  if (iVar16 != 3) goto LAB_002c937b;
  lVar17 = 0;
  uVar15 = 0;
  do {
    uVar3 = local_b8[lVar17];
    if ((uVar3 != 0xffffffff) && (uVar21 = uVar15 + 1, uVar15 = uVar3, uVar3 != uVar21)) {
      emitError(local_d8,DeclStringsInWrongOrder);
      break;
    }
    lVar17 = lVar17 + 1;
  } while (lVar17 == 1);
  if ((DVar11 == Decl_XML) && (CVar22 = XMLVersionRequired, local_b8[0] == 0xffffffff)) {
LAB_002c91fa:
    emitError(pXVar10,CVar22);
  }
  else if (DVar11 == Decl_Text) {
    if (local_b8[2] != -1) {
      emitError(pXVar10,StandaloneNotLegal);
    }
    if (local_b8[1] == -1) {
      CVar22 = EncodingRequired;
      goto LAB_002c91fa;
    }
  }
  bVar13 = ReaderMgr::skippedChar(this_01,L'?');
  if (bVar13) {
    bVar13 = ReaderMgr::skippedChar(this_01,L'>');
    if (!bVar13) {
      emitError(pXVar10,UnterminatedXMLDecl);
      do {
        XVar14 = ReaderMgr::getNextChar(this_01);
        if (XVar14 == L'>') break;
      } while (XVar14 != L'\0');
    }
  }
  else {
    emitError(pXVar10,UnterminatedXMLDecl);
    do {
      XVar14 = ReaderMgr::getNextChar(this_01);
      if (XVar14 == L'\0') break;
    } while (XVar14 != L'>');
  }
  ReaderMgr::getCurrentEncodingStr(this_01);
  if (local_b8[1] != -1) {
    pXVar6 = (pXVar10->fReaderMgr).fCurReader;
    pXVar5 = local_c8->fBuffer;
    pXVar5[local_c8->fIndex] = L'\0';
    bVar13 = XMLReader::setEncoding(pXVar6,pXVar5);
    pXVar5 = local_c8->fBuffer;
    pXVar5[local_c8->fIndex] = L'\0';
    if (!bVar13) {
      emitError(pXVar10,ContradictoryEncoding,pXVar5,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
  if (DVar11 == Decl_XML) {
    pXVar7 = pXVar10->fDocHandler;
    if (pXVar7 != (XMLDocumentHandler *)0x0) {
      local_98->fBuffer[local_98->fIndex] = L'\0';
      local_c8->fBuffer[local_c8->fIndex] = L'\0';
      local_88->fBuffer[local_88->fIndex] = L'\0';
      (*pXVar7->_vptr_XMLDocumentHandler[0xd])();
    }
  }
  else if ((DVar11 == Decl_Text) &&
          (pDVar8 = pXVar10->fDocTypeHandler, pDVar8 != (DocTypeHandler *)0x0)) {
    local_98->fBuffer[local_98->fIndex] = L'\0';
    local_c8->fBuffer[local_c8->fIndex] = L'\0';
    (*pDVar8->_vptr_DocTypeHandler[0x11])();
  }
LAB_002c937b:
  XMLBufferMgr::releaseBuffer(local_60,local_68);
  XMLBufferMgr::releaseBuffer(local_70,local_78);
  XMLBufferMgr::releaseBuffer(local_80,local_88);
  XMLBufferMgr::releaseBuffer(local_c0,local_c8);
  XMLBufferMgr::releaseBuffer(local_90,local_98);
  return;
}

Assistant:

void XMLScanner::scanXMLDecl(const DeclTypes type)
{
    // Get us some buffers to use
    XMLBufBid bbVersion(&fBufMgr);
    XMLBufBid bbEncoding(&fBufMgr);
    XMLBufBid bbStand(&fBufMgr);
    XMLBufBid bbDummy(&fBufMgr);
    XMLBufBid bbName(&fBufMgr);

    //  We use this little enum and array to keep up with what we found
    //  and what order we found them in. This lets us get them free form
    //  without too much overhead, but still know that they were in the
    //  wrong order.
    enum Strings
    {
        VersionString
        , EncodingString
        , StandaloneString
        , UnknownString

        , StringCount
    };
    int flags[StringCount] = { -1, -1, -1, -1 };

    //  Also set up a list of buffers in the right order so that we know
    //  where to put stuff.
    XMLBuffer* buffers[StringCount] ;
    buffers[0] = &bbVersion.getBuffer();
    buffers[1] = &bbEncoding.getBuffer();
    buffers[2] = &bbStand.getBuffer();
    buffers[3] = &bbDummy.getBuffer();

    int curCount = 0;
    Strings curString;
    XMLBuffer& nameBuf = bbName.getBuffer();
    while (true)
    {
        // Skip any spaces
        bool skippedSomething;
        fReaderMgr.skipPastSpaces(skippedSomething, true);

        // If we are looking at a question mark, then break out
        if (fReaderMgr.lookingAtChar(chQuestion))
            break;

        // If this is not the first string, then we require the spaces
        if (!skippedSomething && curCount)
            emitError(XMLErrs::ExpectedWhitespace);

        //  Get characters up to the next whitespace or equal's sign.
        if (!scanUpToWSOr(nameBuf, chEqual))
            emitError(XMLErrs::ExpectedDeclString);

        // See if it matches any of our expected strings
        if (XMLString::equals(nameBuf.getRawBuffer(), XMLUni::fgVersionString))
            curString = VersionString;
        else if (XMLString::equals(nameBuf.getRawBuffer(), XMLUni::fgEncodingString))
            curString = EncodingString;
        else if (XMLString::equals(nameBuf.getRawBuffer(), XMLUni::fgStandaloneString))
            curString = StandaloneString;
        else
            curString = UnknownString;

        //  If its an unknown string, then give that error. Else check to
        //  see if this one has been done already and give that error.
        if (curString == UnknownString)
            emitError(XMLErrs::ExpectedDeclString, nameBuf.getRawBuffer());
        else if (flags[curString] != -1)
            emitError(XMLErrs::DeclStringRep, nameBuf.getRawBuffer());
        else if (flags[curString] == -1)
            flags[curString] = ++curCount;

        //  Scan for an equal's sign. If we don't find it, issue an error
        //  but keep trying to go on.
        if (!scanEq(true))
            emitError(XMLErrs::ExpectedEqSign);

        //  Get a quote string into the buffer for the string that we are
        //  currently working on.
        if (!getQuotedString(*buffers[curString]))
        {
            emitError(XMLErrs::ExpectedQuotedString);
            fReaderMgr.skipPastChar(chCloseAngle);
            return;
        }

        // And validate the value according which one it was
        const XMLCh* rawValue = buffers[curString]->getRawBuffer();
        if (curString == VersionString)
        {
            if (XMLString::equals(rawValue, XMLUni::fgVersion1_1)) {
                if (type == Decl_XML) {
                    fXMLVersion = XMLReader::XMLV1_1;
                    fReaderMgr.setXMLVersion(XMLReader::XMLV1_1);
                }
                else {
                    if (fXMLVersion != XMLReader::XMLV1_1)
                        emitError(XMLErrs::UnsupportedXMLVersion, rawValue);
                }
            }
            else if (XMLString::equals(rawValue, XMLUni::fgVersion1_0)) {
                if (type == Decl_XML) {
                    fXMLVersion = XMLReader::XMLV1_0;
                    fReaderMgr.setXMLVersion(XMLReader::XMLV1_0);
                }
            }
            else if (XMLString::startsWith(rawValue, XMLUni::fgVersion1)) {
                if (type == Decl_XML) {
                    fXMLVersion = XMLReader::XMLV1_0;
                    fReaderMgr.setXMLVersion(XMLReader::XMLV1_0);
                }
            }
            else
                emitError(XMLErrs::UnsupportedXMLVersion, rawValue);
        }
         else if (curString == EncodingString)
        {
            if (!XMLString::isValidEncName(rawValue))
                emitError(XMLErrs::BadXMLEncoding, rawValue);
        }
         else if (curString == StandaloneString)
        {
            if (XMLString::equals(rawValue, XMLUni::fgYesString))
                fStandalone = true;
            else if (XMLString::equals(rawValue, XMLUni::fgNoString))
                fStandalone = false;
            else
            {
                emitError(XMLErrs::BadStandalone);
                //if (!XMLString::compareIString(rawValue, XMLUni::fgYesString))
                //else if (!XMLString::compareIString(rawValue, XMLUni::fgNoString))
                if (buffers[curString]->getLen() == 3 &&
                    (((rawValue[0] == chLatin_y) || (rawValue[0] == chLatin_Y)) &&
                     ((rawValue[1] == chLatin_e) || (rawValue[1] == chLatin_E)) &&
                     ((rawValue[2] == chLatin_s) || (rawValue[2] == chLatin_S))))
                    fStandalone = true;
                else if (buffers[curString]->getLen() == 2 &&
                    (((rawValue[0] == chLatin_n) || (rawValue[0] == chLatin_N)) &&
                     ((rawValue[1] == chLatin_o) || (rawValue[1] == chLatin_O))))
                    fStandalone = false;
            }
        }
    }

    //  Make sure that the strings present are in order. We don't care about
    //  which ones are present at this point, just that any there are in the
    //  right order.
    int curTop = 0;
    for (int index = VersionString; index < StandaloneString; index++)
    {
        if (flags[index] != -1)
        {
            if (flags[index] !=  curTop + 1)
            {
                emitError(XMLErrs::DeclStringsInWrongOrder);
                break;
            }
            curTop = flags[index];
        }
    }

    //  If its an XML decl, the version must be present.
    //  If its a Text decl, then encoding must be present AND standalone must not be present.
    if ((type == Decl_XML) && (flags[VersionString] == -1))
        emitError(XMLErrs::XMLVersionRequired);
    else if (type == Decl_Text) {
        if (flags[StandaloneString] != -1)
            emitError(XMLErrs::StandaloneNotLegal);
        if (flags[EncodingString] == -1)
            emitError(XMLErrs::EncodingRequired);
    }

    if (!fReaderMgr.skippedChar(chQuestion))
    {
        emitError(XMLErrs::UnterminatedXMLDecl);
        fReaderMgr.skipPastChar(chCloseAngle);
    }
     else if (!fReaderMgr.skippedChar(chCloseAngle))
    {
        emitError(XMLErrs::UnterminatedXMLDecl);
        fReaderMgr.skipPastChar(chCloseAngle);
    }

    //  Do this before we possibly update the reader with the
    //  actual encoding string. Otherwise, we will pass the wrong thing
    //  for the last parameter!
    const XMLCh* actualEnc = fReaderMgr.getCurrentEncodingStr();

    //  Ok, we've now seen the real encoding string, if there was one, so
    //  lets call back on the current reader and tell it what the real
    //  encoding string was. If it fails, that's because it represents some
    //  sort of contradiction with the autosensed format, and it keeps the
    //  original encoding.
    //
    //  NOTE: This can fail for a number of reasons, such as a bogus encoding
    //  name or because its in flagrant contradiction of the auto-sensed
    //  format.
    if (flags[EncodingString] != -1)
    {
        if (!fReaderMgr.getCurrentReader()->setEncoding(bbEncoding.getRawBuffer()))
            emitError(XMLErrs::ContradictoryEncoding, bbEncoding.getRawBuffer());
        else
            actualEnc = bbEncoding.getRawBuffer();
    }

    //  If we have a document handler then call the XML Decl callback.
    if (type == Decl_XML)
    {
        if (fDocHandler)
            fDocHandler->XMLDecl
            (
                bbVersion.getRawBuffer()
                , bbEncoding.getRawBuffer()
                , bbStand.getRawBuffer()
                , actualEnc
            );
    }
    else if (type == Decl_Text)
    {
        if (fDocTypeHandler)
            fDocTypeHandler->TextDecl
            (
                bbVersion.getRawBuffer()
                , bbEncoding.getRawBuffer()
            );
    }
}